

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlobImpl.cpp
# Opt level: O2

void * __thiscall
Diligent::DataBlobAllocatorAdapter::Allocate
          (DataBlobAllocatorAdapter *this,size_t Size,Char *dbgDescription,char *dbgFileName,
          Int32 dbgLineNumber)

{
  string msg;
  
  if ((this->m_pDataBlob).m_pObject != (DataBlobImpl *)0x0) {
    FormatString<char[91]>
              (&msg,(char (*) [91])
                    "The data blob has already been created. The allocator does not support more than one blob."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x72);
    std::__cxx11::string::~string((string *)&msg);
  }
  DataBlobImpl::Create((DataBlobImpl *)&msg,Size,(void *)0x0);
  RefCntAutoPtr<Diligent::DataBlobImpl>::operator=
            (&this->m_pDataBlob,(RefCntAutoPtr<Diligent::DataBlobImpl> *)&msg);
  RefCntAutoPtr<Diligent::DataBlobImpl>::Release((RefCntAutoPtr<Diligent::DataBlobImpl> *)&msg);
  return (((this->m_pDataBlob).m_pObject)->m_DataBuff).
         super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
         ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

void* DataBlobAllocatorAdapter::Allocate(size_t Size, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY(!m_pDataBlob, "The data blob has already been created. The allocator does not support more than one blob.");
    m_pDataBlob = DataBlobImpl::Create(Size);
    return m_pDataBlob->GetDataPtr();
}